

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::appendTag(Builder *this,uint64_t tag)

{
  Exception *this_00;
  Builder *in_RSI;
  ValueLength in_RDI;
  ExceptionType in_stack_ffffffffffffffdc;
  Builder *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(*(long *)(in_RDI + 0xb0) + 0x29) & 1) != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,in_stack_ffffffffffffffdc);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  if (in_RSI < (Builder *)0x100) {
    reserve(in_RSI,in_RDI);
    appendByte(in_stack_ffffffffffffffe0,(uint8_t)(in_stack_ffffffffffffffdc >> 0x18));
    appendLengthUnchecked<1ul>(in_RSI,in_RDI);
  }
  else {
    reserve(in_RSI,in_RDI);
    appendByte(in_stack_ffffffffffffffe0,(uint8_t)(in_stack_ffffffffffffffdc >> 0x18));
    appendLengthUnchecked<8ul>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void Builder::appendTag(uint64_t tag) {
  if (options->disallowTags) {
    // Tagged values explicitly disallowed
    throw Exception(Exception::BuilderTagsDisallowed);
  }
  if (tag <= 255) {
    reserve(1 + 1);
    appendByte(0xee);
    appendLengthUnchecked<1>(tag);
  } else {
    reserve(1 + 8);
    appendByte(0xef);
    appendLengthUnchecked<8>(tag);
  }
}